

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,variable_statement *s)

{
  pointer pdVar1;
  bool bVar2;
  scope *psVar3;
  pointer id;
  value init_val;
  wstring_view local_90;
  value local_80;
  value local_58;
  
  id = (s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
       super__Vector_impl_data._M_start;
  pdVar1 = (s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (id != pdVar1) {
    do {
      psVar3 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped);
      bVar2 = scope::has_property(psVar3,&id->id_);
      if (!bVar2) {
        __assert_fail("active_scope_->has_property(d.id())",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                      ,0x382,
                      "completion mjs::interpreter::impl::operator()(const variable_statement &)");
      }
      if ((id->init_)._M_t.
          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
        eval(&local_80,this,
             (id->init_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
        get_value(&local_58,this,&local_80);
        value::destroy(&local_80);
        psVar3 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped)
        ;
        local_90._M_str = (id->id_)._M_dataplus._M_p;
        local_90._M_len = (id->id_)._M_string_length;
        string::string((string *)&local_80,this->heap_,&local_90);
        scope::put_local(psVar3,(string *)&local_80,&local_58);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
        value::destroy(&local_58);
      }
      id = id + 1;
    } while (id != pdVar1);
  }
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const variable_statement& s) {
        for (const auto& d: s.l()) {
            assert(active_scope_->has_property(d.id()));
            if (d.init()) {
                // Evaulate in two steps to avoid using stale activation object pointer in case the evaulation forces a garbage collection
                auto init_val = get_value(eval(*d.init()));
                active_scope_->put_local(string{heap_, d.id()}, init_val);
            }
        }
        return completion{};
    }